

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall
Js::RecyclableProtoObjectWalker::GetGroupObject
          (RecyclableProtoObjectWalker *this,ResolvedObject *pResolvedObject)

{
  Var pvVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  RecyclableObject *pRVar8;
  ArenaAllocator *alloc;
  IDiagObjectModelDisplay *pIVar9;
  RecyclableProtoObjectAddress *this_00;
  char16_t *pcVar10;
  Type TVar11;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xd53,"(pResolvedObject)","pResolvedObject");
    if (!bVar3) goto LAB_008c79a6;
    *puVar6 = 0;
  }
  bVar3 = ((((((this->super_RecyclableObjectWalker).scriptContext)->super_ScriptContextBase).
            javascriptLibrary)->super_JavascriptLibraryBase).objectPrototype.ptr)->__proto__Enabled;
  pcVar10 = L"[prototype]";
  if (bVar3 != false) {
    pcVar10 = L"__proto__";
  }
  pResolvedObject->name = pcVar10;
  pResolvedObject->propId = bVar3 - 1 | 0x1eb;
  pRVar7 = VarTo<Js::RecyclableObject>((this->super_RecyclableObjectWalker).instance);
  pRVar8 = RecyclableObject::GetPrototype(pRVar7);
  if (pRVar8 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xd64,"(obj->GetPrototype() != nullptr)",
                                "obj->GetPrototype() != nullptr");
    if (!bVar4) goto LAB_008c79a6;
    *puVar6 = 0;
  }
  pRVar8 = RecyclableObject::GetPrototype(pRVar7);
  if (((pRVar8->type).ptr)->typeId == TypeIds_Null) {
    pRVar8 = RecyclableObject::GetPrototype(pRVar7);
    if ((((pRVar8->type).ptr)->typeId != TypeIds_Null) ||
       (((pRVar7->type).ptr)->typeId != TypeIds_UnscopablesWrapperObject)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xd66,
                                  "(obj->GetPrototype()->GetTypeId() != TypeIds_Null || (obj->GetPrototype()->GetTypeId() == TypeIds_Null && obj->GetTypeId() == TypeIds_UnscopablesWrapperObject))"
                                  ,
                                  "obj->GetPrototype()->GetTypeId() != TypeIds_Null || (obj->GetPrototype()->GetTypeId() == TypeIds_Null && obj->GetTypeId() == TypeIds_UnscopablesWrapperObject)"
                                 );
      if (!bVar4) goto LAB_008c79a6;
      *puVar6 = 0;
    }
  }
  pRVar7 = RecyclableObject::GetPrototype(pRVar7);
  pResolvedObject->obj = pRVar7;
  pvVar1 = (this->super_RecyclableObjectWalker).originalInstance;
  if (pvVar1 != (Var)0x0) {
    pRVar7 = VarTo<Js::RecyclableObject>(pvVar1);
  }
  pResolvedObject->originalObj = pRVar7;
  pResolvedObject->scriptContext = (this->super_RecyclableObjectWalker).scriptContext;
  pvVar1 = pResolvedObject->obj;
  if (pvVar1 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_008c79a6;
    *puVar6 = 0;
  }
  if (((ulong)pvVar1 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar1 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_008c79a6;
    *puVar6 = 0;
  }
  TVar11 = TypeIds_FirstNumberType;
  if ((((ulong)pvVar1 & 0xffff000000000000) != 0x1000000000000) &&
     (TVar11 = TypeIds_Number, (ulong)pvVar1 >> 0x32 == 0)) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar1);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_008c79a6;
      *puVar6 = 0;
    }
    TVar11 = ((pRVar7->type).ptr)->typeId;
    if (0x57 < (int)TVar11) {
      BVar5 = RecyclableObject::IsExternal(pRVar7);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) {
LAB_008c79a6:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
  }
  pResolvedObject->typeId = TVar11;
  alloc = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
  pIVar9 = ResolvedObject::CreateDisplay(pResolvedObject);
  pResolvedObject->objectDisplay = pIVar9;
  (*pIVar9->_vptr_IDiagObjectModelDisplay[6])(pIVar9,(ulong)(bVar3 ^ 1) << 5);
  this_00 = (RecyclableProtoObjectAddress *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
  RecyclableProtoObjectAddress::RecyclableProtoObjectAddress
            (this_00,(this->super_RecyclableObjectWalker).instance,0x124,pResolvedObject->obj);
  pResolvedObject->address = (IDiagObjectAddress *)this_00;
  return 1;
}

Assistant:

BOOL RecyclableProtoObjectWalker::GetGroupObject(ResolvedObject* pResolvedObject)
    {
        Assert(pResolvedObject);

        DBGPROP_ATTRIB_FLAGS defaultAttributes = DBGPROP_ATTRIB_NO_ATTRIB;
        if (scriptContext->GetLibrary()->GetObjectPrototypeObject()->is__proto__Enabled())
        {
            pResolvedObject->name           = _u("__proto__");
            pResolvedObject->propId         = PropertyIds::__proto__;
        }
        else
        {
            pResolvedObject->name           = _u("[prototype]");
            pResolvedObject->propId         = Constants::NoProperty; // This property will not be editable.
            defaultAttributes               = DBGPROP_ATTRIB_VALUE_IS_FAKE;
        }

        RecyclableObject *obj               = Js::VarTo<Js::RecyclableObject>(instance);

        Assert(obj->GetPrototype() != nullptr);
        //UnscopablesWrapperObjects prototype is null
        Assert(obj->GetPrototype()->GetTypeId() != TypeIds_Null || (obj->GetPrototype()->GetTypeId() == TypeIds_Null && obj->GetTypeId() == TypeIds_UnscopablesWrapperObject));

        pResolvedObject->obj                = obj->GetPrototype();
        pResolvedObject->originalObj        = (originalInstance != nullptr) ? Js::VarTo<Js::RecyclableObject>(originalInstance) : pResolvedObject->obj;
        pResolvedObject->scriptContext      = scriptContext;
        pResolvedObject->typeId             = JavascriptOperators::GetTypeId(pResolvedObject->obj);

        ArenaAllocator * arena = GetArenaFromContext(scriptContext);
        pResolvedObject->objectDisplay      = pResolvedObject->CreateDisplay();
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(defaultAttributes);

        pResolvedObject->address = Anew(arena,
            RecyclableProtoObjectAddress,
            instance,
            PropertyIds::prototype,
            pResolvedObject->obj);

        return TRUE;
    }